

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

void cs::compiler_type::dump_expr(iterator it,ostream *stream)

{
  int iVar1;
  token_base **pptVar2;
  iterator iVar3;
  iterator local_10;
  
  local_10.mData = it.mData;
  if (it.mData == (tree_node *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"< Empty Expression >",0x14);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<",1);
  pptVar2 = tree_type<cs::token_base_*>::iterator::data(&local_10);
  if (*pptVar2 != (token_base *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream," Tree Node = ",0xd);
    pptVar2 = tree_type<cs::token_base_*>::iterator::data(&local_10);
    iVar1 = (*(*pptVar2)->_vptr_token_base[4])(*pptVar2,stream);
    if ((char)iVar1 != '\0') goto LAB_001655ec;
  }
  iVar3 = tree_type<cs::token_base_*>::iterator::left(&local_10);
  if (iVar3.mData != (tree_node *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream," Left Leaf = ",0xd);
    iVar3 = tree_type<cs::token_base_*>::iterator::left(&local_10);
    dump_expr(iVar3,stream);
  }
  iVar3 = tree_type<cs::token_base_*>::iterator::right(&local_10);
  if (iVar3.mData != (tree_node *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream," Right Leaf = ",0xe);
    iVar3 = tree_type<cs::token_base_*>::iterator::right(&local_10);
    dump_expr(iVar3,stream);
  }
LAB_001655ec:
  std::__ostream_insert<char,std::char_traits<char>>(stream," >",2);
  return;
}

Assistant:

void compiler_type::dump_expr(tree_type<token_base *>::iterator it, std::ostream &stream)
	{
		if (!it.usable()) {
			stream << "< Empty Expression >";
			return;
		}
		stream << "<";
		bool cutoff = false;
		if (it.data() != nullptr) {
			stream << " Tree Node = ";
			cutoff = it.data()->dump(stream);
		}
		if (!cutoff) {
			if (it.left().usable()) {
				stream << " Left Leaf = ";
				dump_expr(it.left(), stream);
			}
			if (it.right().usable()) {
				stream << " Right Leaf = ";
				dump_expr(it.right(), stream);
			}
		}
		stream << " >";
	}